

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *pFVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  int binmode;
  int status;
  BuildCtx *ctx;
  BuildCtx ctx_;
  char **argv_local;
  int argc_local;
  
  ctx_.reloc[199]._4_8_ = argv;
  parseargs((BuildCtx *)&ctx,argv);
  uVar2 = build_code((BuildCtx *)&ctx);
  if (uVar2 == 0) {
    if (((char)(ctx_.fp)->_flags == '-') && (*(char *)((long)&(ctx_.fp)->_flags + 1) == '\0')) {
      ctx_.mode = _stdout;
      ctx_._12_4_ = stdout_4;
    }
    else {
      pcVar5 = "w";
      if ((int)ctx_.D == 3 || (int)ctx_.D == 4) {
        pcVar5 = "wb";
      }
      ctx_._8_8_ = fopen((char *)ctx_.fp,pcVar5);
      pFVar1 = _stderr;
      if ((FILE *)ctx_._8_8_ == (FILE *)0x0) {
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        fprintf(pFVar1,"Error: cannot open output file \'%s\': %s\n",ctx_.fp,pcVar5);
        exit(1);
      }
    }
    switch((int)ctx_.D) {
    case 0:
    case 1:
    case 2:
      emit_asm((BuildCtx *)&ctx);
      emit_asm_debug((BuildCtx *)&ctx);
      break;
    case 3:
      emit_peobj((BuildCtx *)&ctx);
      break;
    case 4:
      emit_raw((BuildCtx *)&ctx);
      break;
    case 5:
      emit_bcdef((BuildCtx *)&ctx);
      emit_lib((BuildCtx *)&ctx);
      break;
    case 6:
    case 7:
    case 8:
      emit_lib((BuildCtx *)&ctx);
      break;
    case 9:
      emit_vmdef((BuildCtx *)&ctx);
      emit_lib((BuildCtx *)&ctx);
      fprintf((FILE *)ctx_._8_8_,"}\n\n");
      break;
    case 10:
      emit_fold((BuildCtx *)&ctx);
    }
    fflush((FILE *)ctx_._8_8_);
    iVar3 = ferror((FILE *)ctx_._8_8_);
    pFVar1 = _stderr;
    if (iVar3 != 0) {
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      fprintf(pFVar1,"Error: cannot write to output file: %s\n",pcVar5);
      exit(1);
    }
    fclose((FILE *)ctx_._8_8_);
    argv_local._4_4_ = 0;
  }
  else {
    fprintf(_stderr,"Error: DASM error %08x\n",(ulong)uVar2);
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv)
{
  BuildCtx ctx_;
  BuildCtx *ctx = &ctx_;
  int status, binmode;

  if (sizeof(void *) != 4*LJ_32+8*LJ_64) {
    fprintf(stderr,"Error: pointer size mismatch in cross-build.\n");
    fprintf(stderr,"Try: make HOST_CC=\"gcc -m32\" CROSS=...\n\n");
    return 1;
  }

  UNUSED(argc);
  parseargs(ctx, argv);

  if ((status = build_code(ctx))) {
    fprintf(stderr,"Error: DASM error %08x\n", status);
    return 1;
  }

  switch (ctx->mode) {
  case BUILD_peobj:
  case BUILD_raw:
    binmode = 1;
    break;
  default:
    binmode = 0;
    break;
  }

  if (ctx->outname[0] == '-' && ctx->outname[1] == '\0') {
    ctx->fp = stdout;
#if defined(_WIN32)
    if (binmode)
      _setmode(_fileno(stdout), _O_BINARY);  /* Yuck. */
#endif
  } else if (!(ctx->fp = fopen(ctx->outname, binmode ? "wb" : "w"))) {
    fprintf(stderr, "Error: cannot open output file '%s': %s\n",
	    ctx->outname, strerror(errno));
    exit(1);
  }

  switch (ctx->mode) {
  case BUILD_elfasm:
  case BUILD_coffasm:
  case BUILD_machasm:
    emit_asm(ctx);
    emit_asm_debug(ctx);
    break;
  case BUILD_peobj:
    emit_peobj(ctx);
    break;
  case BUILD_raw:
    emit_raw(ctx);
    break;
  case BUILD_bcdef:
    emit_bcdef(ctx);
    emit_lib(ctx);
    break;
  case BUILD_vmdef:
    emit_vmdef(ctx);
    emit_lib(ctx);
    fprintf(ctx->fp, "}\n\n");
    break;
  case BUILD_ffdef:
  case BUILD_libdef:
  case BUILD_recdef:
    emit_lib(ctx);
    break;
  case BUILD_folddef:
    emit_fold(ctx);
    break;
  default:
    break;
  }

  fflush(ctx->fp);
  if (ferror(ctx->fp)) {
    fprintf(stderr, "Error: cannot write to output file: %s\n",
	    strerror(errno));
    exit(1);
  }
  fclose(ctx->fp);

  return 0;
}